

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::on_piece_hashed
          (torrent *this,vector<sha256_hash> *block_hashes,piece_index_t piece,sha1_hash *piece_hash
          ,storage_error *error)

{
  _Atomic_word *p_Var1;
  mutex_type *pmVar2;
  byte bVar3;
  element_type *peVar4;
  session_interface *psVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  error_category *peVar9;
  ulong_long_type uVar10;
  bool bVar11;
  int iVar12;
  piece_index_t pVar13;
  tribool tVar14;
  int64_t file_offset;
  long lVar15;
  undefined4 extraout_var;
  file_storage *this_00;
  undefined4 extraout_var_00;
  long *plVar16;
  undefined4 extraout_var_01;
  int *piVar17;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  piece_block block;
  char cVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  error_code eVar26;
  span<const_libtorrent::digest32<256L>_> block_hashes_00;
  peer_request pVar27;
  undefined1 local_b0 [8];
  undefined8 uStack_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  pointer local_90;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *local_88;
  undefined1 local_80 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  if (((this->super_torrent_hot_members).field_0x4b & 4) != 0) {
    return;
  }
  if ((this->field_0x5e0 & 4) != 0) {
    return;
  }
  local_88 = &block_hashes->
              super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
  ;
  state_updated(this);
  (this->m_num_checked_pieces).m_val = (this->m_num_checked_pieces).m_val + 1;
  if ((error->ec).val_ == 0) goto LAB_0031e8ad;
  local_b0 = (undefined1  [8])0x100000002;
  uStack_a8 = &boost::system::detail::cat_holder<void>::generic_category_instance;
  iVar12 = (*((error->ec).cat_)->_vptr_error_category[2])();
  if (((char)iVar12 == '\0') &&
     (iVar12 = (*(uStack_a8->super_error_category)._vptr_error_category[3])
                         (uStack_a8,error,(ulong)local_b0 & 0xffffffff), (char)iVar12 == '\0')) {
    if ((DAT_004fcee8 != 0x8fafd21e25c5e09b) && (DAT_004fcee8 != 0xb2ab117a257edf0d)) {
      (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                (&boost::asio::error::get_misc_category()::instance);
    }
    if ((error->ec).val_ == 2) {
      peVar9 = (error->ec).cat_;
      bVar11 = peVar9->id_ == DAT_004fcee8;
      if (DAT_004fcee8 == 0) {
        bVar11 = peVar9 == (error_category *)&boost::asio::error::get_misc_category()::instance;
      }
      if (bVar11) goto LAB_0031e860;
    }
    eVar26 = errors::make_error_code(file_too_short);
    if ((error->ec).val_ != eVar26.val_) {
LAB_0031ef89:
      this->m_checking_piece = 0;
      this->m_num_checked_pieces = 0;
      iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_04,iVar12) + 0x68) & 0x49) != 0) {
        iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        resolve_filename_abi_cxx11_
                  ((string *)local_b0,this,(file_index_t)(int)*(int3 *)&error->field_0x10);
        get_handle((torrent *)(local_80 + 0x18));
        alert_manager::
        emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                  ((alert_manager *)CONCAT44(extraout_var_05,iVar12),&error->ec,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &error->operation,(torrent_handle *)(local_80 + 0x18));
        if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(local_60._M_pi)->_M_weak_count;
            iVar12 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar12 = (local_60._M_pi)->_M_weak_count;
            (local_60._M_pi)->_M_weak_count = iVar12 + -1;
          }
          if (iVar12 == 1) {
            (*(local_60._M_pi)->_vptr__Sp_counted_base[3])();
          }
        }
        if (local_b0 != (undefined1  [8])&local_a0) {
          operator_delete((void *)local_b0,local_a0._M_allocated_capacity + 1);
        }
      }
      iVar12 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      if ((char)iVar12 != '\0') {
        uVar19 = (error->ec).val_;
        peVar9 = (error->ec).cat_;
        (*peVar9->_vptr_error_category[4])(local_b0,peVar9,(ulong)uVar19);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"on_piece_hashed, fatal disk error: (%d) %s",(ulong)uVar19,local_b0);
        if (local_b0 != (undefined1  [8])&local_a0) {
          operator_delete((void *)local_b0,local_a0._M_allocated_capacity + 1);
        }
      }
      auto_managed(this,false);
      pause(this);
      set_error(this,&error->ec,(file_index_t)(int)*(int3 *)&error->field_0x10);
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
      return;
    }
    peVar9 = (error->ec).cat_;
    uVar10 = (eVar26.cat_)->id_;
    bVar11 = peVar9->id_ == uVar10;
    if (uVar10 == 0) {
      bVar11 = peVar9 == eVar26.cat_;
    }
    if (!bVar11) goto LAB_0031ef89;
  }
LAB_0031e860:
  peVar4 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  file_offset = file_storage::file_size
                          (&peVar4->m_files,(file_index_t)(int)*(int3 *)&error->field_0x10);
  pVar27 = file_storage::map_file
                     (&peVar4->m_files,(file_index_t)(int)*(int3 *)&error->field_0x10,file_offset,0)
  ;
  pVar13 = pVar27.piece.m_val;
  iVar12 = (this->m_checking_piece).m_val;
  iVar18 = pVar13.m_val - iVar12;
  if (iVar18 != 0 && iVar12 <= pVar13.m_val) {
    (this->m_num_checked_pieces).m_val = (this->m_num_checked_pieces).m_val + iVar18;
    (this->m_checking_piece).m_val = pVar13.m_val;
  }
LAB_0031e8ad:
  psVar5 = (this->super_torrent_hot_members).m_ses;
  lVar15 = ((long)(this->m_num_checked_pieces).m_val * 1000000) /
           (long)(((this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->m_files).m_num_pieces;
  *(short *)&this->field_0x604 = (short)lVar15;
  uVar19 = ((byte)this->field_0x606 & 0xf0) << 0x10 | (uint)lVar15 & 0xf0000;
  uVar20 = (ulong)(uVar19 >> 0x10);
  this->field_0x606 = (char)(uVar19 >> 0x10);
  iVar12 = (*(psVar5->super_session_logger)._vptr_session_logger[0x2e])();
  local_b0 = (undefined1  [8])(CONCAT44(extraout_var,iVar12) + 0x438);
  uStack_a8 = (generic_error_category *)((ulong)uStack_a8 & 0xffffffffffffff00);
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b0);
  uStack_a8 = (generic_error_category *)CONCAT71(uStack_a8._1_7_,1);
  uVar19 = *(uint *)(CONCAT44(extraout_var,iVar12) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
  cVar21 = '\x01';
  tVar14.value = true_value;
  if ((uVar19 >> 0x16 & 1) == 0) {
    bVar11 = digest32<160L>::is_all_zeros
                       (&(((this->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_info_hash).v1);
    tVar14.value = indeterminate_value;
    cVar21 = '\x02';
    if (!bVar11) {
      torrent_info::hash_for_piece
                ((sha1_hash *)local_b0,
                 (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 piece);
      auVar24[0] = -(*(__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)
                      (piece_hash->m_number)._M_elems == local_b0[0]);
      auVar24[1] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 1) == local_b0[1]);
      auVar24[2] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 2) == local_b0[2]);
      auVar24[3] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 3) == local_b0[3]);
      auVar24[4] = -((char)(piece_hash->m_number)._M_elems[1] == local_b0[4]);
      auVar24[5] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 5) == local_b0[5]);
      auVar24[6] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 6) == local_b0[6]);
      auVar24[7] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 7) == local_b0[7]);
      auVar24[8] = -((bool)(char)(piece_hash->m_number)._M_elems[2] == uStack_a8._0_1_);
      auVar24[9] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 9) == uStack_a8._1_1_);
      auVar24[10] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 10) == uStack_a8._2_1_);
      auVar24[0xb] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 0xb) == uStack_a8._3_1_);
      auVar24[0xc] = -((char)(piece_hash->m_number)._M_elems[3] == uStack_a8._4_1_);
      auVar24[0xd] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 0xd) == uStack_a8._5_1_);
      auVar24[0xe] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 0xe) == uStack_a8._6_1_);
      auVar24[0xf] = -(*(char *)((long)(piece_hash->m_number)._M_elems + 0xf) == uStack_a8._7_1_);
      uVar19 = (piece_hash->m_number)._M_elems[4];
      auVar25[0] = -((char)uVar19 == (char)local_a0._M_allocated_capacity._0_4_);
      auVar25[1] = -((char)(uVar19 >> 8) == (char)((uint)local_a0._0_4_ >> 8));
      auVar25[2] = -((char)(uVar19 >> 0x10) == (char)((uint)local_a0._0_4_ >> 0x10));
      auVar25[3] = -((char)(uVar19 >> 0x18) == (char)((uint)local_a0._0_4_ >> 0x18));
      auVar25[4] = 0xff;
      auVar25[5] = 0xff;
      auVar25[6] = 0xff;
      auVar25[7] = 0xff;
      auVar25[8] = 0xff;
      auVar25[9] = 0xff;
      auVar25[10] = 0xff;
      auVar25[0xb] = 0xff;
      auVar25[0xc] = 0xff;
      auVar25[0xd] = 0xff;
      auVar25[0xe] = 0xff;
      auVar25[0xf] = 0xff;
      auVar25 = auVar25 & auVar24;
      cVar21 = (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff;
    }
    bVar11 = digest32<256L>::is_all_zeros
                       (&(((this->super_torrent_hot_members).m_torrent_file.
                           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->m_info_hash).v2);
    if ((!bVar11) && (cVar21 != '\0')) {
      block_hashes_00.m_len = uVar20;
      block_hashes_00.m_ptr =
           (((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              *)&(local_88->
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 )._M_impl)->_M_impl).super__Vector_impl_data._M_start;
      tVar14 = on_blocks_hashed(this,piece,block_hashes_00);
    }
  }
  bVar22 = tVar14.value == false_value;
  bVar23 = cVar21 == '\x01';
  bVar11 = cVar21 == '\0' || tVar14.value == true_value;
  if ((bVar11 && (bVar23 || bVar22)) ||
     (!(bool)(((cVar21 == '\0' && (!bVar23 && !bVar22)) && tVar14.value == true_value) |
             (bVar23 && bVar22) & ~bVar11))) {
    if ((cVar21 == '\0' && tVar14.value == false_value) ||
       (cVar21 != '\x01' && tVar14.value != true_value)) {
      if (tVar14.value == indeterminate_value && (cVar21 == '\x02' && (error->ec).val_ == 0)) {
        need_picker(this);
        uVar19 = piece_picker::blocks_in_piece
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,piece);
        if (0 < (int)uVar19) {
          block.block_index = 0;
          block.piece_index.m_val = piece.m_val;
          uVar20 = (ulong)uVar19;
          do {
            piece_picker::mark_as_finished
                      ((this->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                       block,(torrent_peer *)0x0);
            block = (piece_block)((long)block + 0x100000000);
            uVar20 = uVar20 - 1;
          } while (uVar20 != 0);
        }
      }
    }
    else {
      if (((this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
           (piece_picker *)0x0) || (((this->super_torrent_hot_members).field_0x4b & 0x40) == 0)) {
        need_picker(this);
        piece_picker::we_have
                  ((this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,piece
                  );
        bVar3 = (this->m_need_save_resume_data).m_val;
        if ((bVar3 & 0x10) == 0) {
          (this->m_need_save_resume_data).m_val = bVar3 | 0x10;
          state_updated(this);
        }
        update_gauge(this);
      }
      we_have(this,piece,false);
    }
    if (((this->m_checking_piece).m_val <
         (((this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files
         ).m_num_pieces) &&
       ((this->super_torrent_hot_members).m_picker._M_t.
        super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
        ._M_t.
        super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
        .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
        (piece_picker *)0x0)) {
      do {
        bVar11 = piece_picker::have_piece
                           ((this->super_torrent_hot_members).m_picker._M_t.
                            super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                            .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                            _M_head_impl,(piece_index_t)(this->m_checking_piece).m_val);
        if (!bVar11) break;
        iVar12 = (this->m_checking_piece).m_val + 1;
        (this->m_checking_piece).m_val = iVar12;
        (this->m_num_checked_pieces).m_val = (this->m_num_checked_pieces).m_val + 1;
      } while (iVar12 < (((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files).m_num_pieces);
    }
    peVar4 = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar12 = (peVar4->m_files).m_num_pieces;
    if ((this->m_num_checked_pieces).m_val < iVar12) {
      uVar20 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
      if ((((uVar20 & 0xe00000008000000) == 0x200000000000000) && ((uVar20 & 0x14000000) == 0)) &&
         ((this->m_error).failed_ == false)) {
        if ((this->m_checking_piece).m_val < iVar12) {
          bVar11 = digest32<160L>::is_all_zeros(&(peVar4->m_info_hash).v1);
          bVar22 = digest32<256L>::is_all_zeros
                             (&(((this->super_torrent_hot_members).m_torrent_file.
                                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_info_hash).v2);
          if (!bVar22) {
            this_00 = torrent_info::orig_files
                                ((this->super_torrent_hot_members).m_torrent_file.
                                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
            iVar12 = file_storage::blocks_in_piece2
                               (this_00,(piece_index_t)(this->m_checking_piece).m_val);
            ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ::resize(local_88,(long)iVar12);
          }
          pdVar6 = (((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      *)&(local_88->
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         )._M_impl)->_M_impl).super__Vector_impl_data._M_start;
          pdVar7 = (((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      *)&(local_88->
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         )._M_impl)->_M_impl).super__Vector_impl_data._M_finish;
          iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[4])();
          local_80._20_4_ = (this->m_storage).m_idx.m_val;
          local_80._16_4_ = (this->m_checking_piece).m_val;
          ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<libtorrent::aux::torrent,void>
                    ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_b0,
                     (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                     &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
          pdVar8 = (((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      *)&(local_88->
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         )._M_impl)->_M_impl).super__Vector_impl_data._M_start;
          local_a0._8_8_ =
               (((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  *)&(local_88->
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     )._M_impl)->_M_impl).super__Vector_impl_data._M_finish;
          local_90 = (((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        *)&(local_88->
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           )._M_impl)->_M_impl).super__Vector_impl_data._M_end_of_storage;
          (local_88->
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_88->
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             *)&(local_88->
                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                )._M_impl)->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_48._0_16_ = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_a0._M_allocated_capacity = (size_type)pdVar8;
          plVar16 = (long *)operator_new(0x28);
          uVar20 = (ulong)uStack_a8;
          *plVar16 = (long)local_b0;
          plVar16[1] = 0;
          uStack_a8 = (generic_error_category *)0x0;
          plVar16[1] = uVar20;
          local_b0 = (undefined1  [8])0x0;
          plVar16[2] = (long)pdVar8;
          plVar16[3] = local_a0._8_8_;
          plVar16[4] = (long)local_90;
          local_90 = (pointer)0x0;
          local_a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      )0x0;
          local_58._0_8_ = plVar16;
          local_48._8_8_ =
               ::std::
               _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2636:7)>
               ::_M_invoke;
          local_48._0_8_ =
               ::std::
               _Function_handler<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_const_libtorrent::digest32<160L>_&,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2636:7)>
               ::_M_manager;
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar12) + 0x20))
                    ((long *)CONCAT44(extraout_var_00,iVar12),local_80._20_4_,local_80._16_4_,pdVar6
                     ,(long)pdVar7 - (long)pdVar6 >> 5,!bVar11 << 5 | 0x18,local_58);
          if ((pointer)local_48._0_8_ != (pointer)0x0) {
            (*(code *)local_48._0_8_)(local_58,local_58,3);
          }
          on_piece_hashed(libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::digest32<160l>const&,libtorrent::storage_error_const&)
          ::$_0::~__0((__0 *)local_b0);
          (this->m_checking_piece).m_val = (this->m_checking_piece).m_val + 1;
          (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x1f])();
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"on_piece_hashed, m_checking_piece: %d",
                     (ulong)(uint)(this->m_checking_piece).m_val);
        }
      }
      else {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"on_piece_hashed, checking paused");
        if (((this->m_checking_piece).m_val == (this->m_num_checked_pieces).m_val) &&
           (iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])(),
           (*(uint *)(CONCAT44(extraout_var_02,iVar12) + 0x68) & 0x40) != 0)) {
          iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          get_handle((torrent *)local_80);
          alert_manager::emplace_alert<libtorrent::torrent_paused_alert,libtorrent::torrent_handle>
                    ((alert_manager *)CONCAT44(extraout_var_03,iVar12),(torrent_handle *)local_80);
          plVar16 = (long *)CONCAT44(local_80._12_4_,local_80._8_4_);
          if (plVar16 != (long *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              piVar17 = (int *)((long)plVar16 + 0xc);
              iVar12 = *piVar17;
              *piVar17 = *piVar17 + -1;
              UNLOCK();
            }
            else {
              iVar12 = *(int *)((long)plVar16 + 0xc);
              *(int *)((long)plVar16 + 0xc) = iVar12 + -1;
            }
            if (iVar12 == 1) {
              (**(code **)(*plVar16 + 0x18))();
            }
          }
        }
      }
    }
    else {
      (*(this->super_request_callback)._vptr_request_callback[7])(this,"on_piece_hashed, completed")
      ;
      iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x2e])();
      lVar15 = CONCAT44(extraout_var_01,iVar12);
      pmVar2 = (mutex_type *)(lVar15 + 0x438);
      uStack_a8 = (generic_error_category *)((ulong)uStack_a8 & 0xffffffffffffff00);
      local_b0 = (undefined1  [8])pmVar2;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b0);
      uStack_a8._0_1_ = true;
      uVar19 = *(uint *)(lVar15 + 0x24c);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
      if (0x7ffffffe < uVar19) {
        uVar19 = 0x7fffffff;
      }
      uStack_a8._0_1_ = false;
      local_b0 = (undefined1  [8])pmVar2;
      local_80._0_4_ = uVar19;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b0);
      uStack_a8._0_1_ = true;
      uVar19 = *(uint *)(lVar15 + 0x250);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
      local_80._4_4_ = 0x7fffffff;
      if (uVar19 < 0x7fffffff) {
        local_80._4_4_ = uVar19;
      }
      uStack_a8._0_1_ = false;
      local_b0 = (undefined1  [8])pmVar2;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b0);
      uStack_a8 = (generic_error_category *)CONCAT71(uStack_a8._1_7_,true);
      uVar19 = *(uint *)(lVar15 + 0x264);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
      local_80._8_4_ = 0x7fffffff;
      if (uVar19 < 0x7fffffff) {
        local_80._8_4_ = uVar19;
      }
      piVar17 = (int *)local_80;
      lVar15 = 4;
      do {
        if (*(int *)(local_80 + lVar15) < *piVar17) {
          piVar17 = (int *)(local_80 + lVar15);
        }
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0xc);
      iVar12 = *piVar17;
      iVar18 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x1c])();
      if ((iVar12 < iVar18) && ((this->field_0x600 & 1) != 0)) {
        set_paused(this,true,(pause_flags_t)0x0);
      }
      files_checked(this);
      this->m_checking_piece = 0;
      this->m_num_checked_pieces = 0;
    }
  }
  else {
    handle_inconsistent_hashes(this,piece);
  }
  return;
}

Assistant:

void torrent::on_piece_hashed(aux::vector<sha256_hash> block_hashes
		, piece_index_t const piece, sha1_hash const& piece_hash
		, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_abort) return;
		if (m_deleted) return;

		state_updated();

		++m_num_checked_pieces;

		if (error)
		{
			if (error.ec == boost::system::errc::no_such_file_or_directory
				|| error.ec == boost::asio::error::eof
				|| error.ec == lt::errors::file_too_short
#ifdef TORRENT_WINDOWS
				|| error.ec == error_code(ERROR_HANDLE_EOF, system_category())
#endif
				)
			{
				TORRENT_ASSERT(error.file() >= file_index_t(0));

				// skip this file by updating m_checking_piece to the first piece following it
				file_storage const& st = m_torrent_file->files();
				std::int64_t file_size = st.file_size(error.file());
				piece_index_t last = st.map_file(error.file(), file_size, 0).piece;
				if (m_checking_piece < last)
				{
					int diff = static_cast<int>(last) - static_cast<int>(m_checking_piece);
					m_num_checked_pieces = piece_index_t(static_cast<int>(m_num_checked_pieces) + diff);
					m_checking_piece = last;
				}
			}
			else
			{
				m_checking_piece = piece_index_t{0};
				m_num_checked_pieces = piece_index_t{0};
				if (m_ses.alerts().should_post<file_error_alert>())
					m_ses.alerts().emplace_alert<file_error_alert>(error.ec,
						resolve_filename(error.file()), error.operation, get_handle());

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("on_piece_hashed, fatal disk error: (%d) %s", error.ec.value()
						, error.ec.message().c_str());
				}
#endif
				auto_managed(false);
				pause();
				set_error(error.ec, error.file());

				// recalculate auto-managed torrents sooner
				// in order to start checking the next torrent
				m_ses.trigger_auto_manage();
				return;
			}
		}

		m_progress_ppm = std::uint32_t(std::int64_t(static_cast<int>(m_num_checked_pieces))
			* 1000000 / torrent_file().num_pieces());

		boost::tribool hash_passed[2]
			= { boost::indeterminate, boost::indeterminate };

		if (!settings().get_bool(settings_pack::disable_hash_checks))
		{
			if (torrent_file().info_hashes().has_v1())
				hash_passed[0] = piece_hash == m_torrent_file->hash_for_piece(piece);

			// if the v1 hash failed the check, don't add the v2 hashes to the
			// merkle tree. They are most likely invalid.
			if (torrent_file().info_hashes().has_v2() && !bool(hash_passed[0] == false))
			{
				hash_passed[1] = on_blocks_hashed(piece, block_hashes);
			}
		}
		else
		{
			hash_passed[0] = hash_passed[1] = true;
		}

		if ((hash_passed[0] && !hash_passed[1]) || (!hash_passed[0] && hash_passed[1]))
		{
			handle_inconsistent_hashes(piece);
			return;
		}
		else if (hash_passed[0] || hash_passed[1])
		{
			if (has_picker() || !m_have_all)
			{
				need_picker();
				m_picker->we_have(piece);
				set_need_save_resume(torrent_handle::if_download_progress);
				update_gauge();
			}
			we_have(piece);
		}
		else if (!error
			&& boost::indeterminate(hash_passed[0])
			&& boost::indeterminate(hash_passed[1]))
		{
			// The data exists but we don't have the hashes needed to verify
			// it yet. This is a special case because we want to say we have
			// the piece once the hash is verified and not download the data
			// unless the hash check fails. To get this effect we setup the
			// piece's state in the piece picker so that it looks like a piece
			// which is finished but not hash checked.
			need_picker();
			int const blocks_in_piece = m_picker->blocks_in_piece(piece);
			for (int i = 0; i < blocks_in_piece; ++i)
				m_picker->mark_as_finished(piece_block(piece, i), nullptr);
		}

		if (m_checking_piece < m_torrent_file->end_piece() && has_picker())
		{
			// skip pieces we already have
			while (m_picker->have_piece(m_checking_piece))
			{
				++m_checking_piece;
				++m_num_checked_pieces;
				if (m_checking_piece >= m_torrent_file->end_piece())
				{
					// actually, we already have outstanding jobs for
					// the remaining pieces. We just need to wait for them
					// to finish
					break;
				}
			}
		}

		if (m_num_checked_pieces < m_torrent_file->end_piece())
		{
			// we paused the checking
			if (!should_check_files())
			{
#ifndef TORRENT_DISABLE_LOGGING
				debug_log("on_piece_hashed, checking paused");
#endif
				if (m_checking_piece == m_num_checked_pieces)
				{
					// we are paused, and we just completed the last outstanding job.
					// now we can be considered paused
					if (alerts().should_post<torrent_paused_alert>())
						alerts().emplace_alert<torrent_paused_alert>(get_handle());
				}
				return;
			}

			if (m_checking_piece >= m_torrent_file->end_piece())
				return;

			auto flags = disk_interface::sequential_access | disk_interface::volatile_read;

			if (torrent_file().info_hashes().has_v1())
				flags |= disk_interface::v1_hash;
			if (torrent_file().info_hashes().has_v2())
				block_hashes.resize(torrent_file().orig_files().blocks_in_piece2(m_checking_piece));

			span<sha256_hash> v2_span(block_hashes);
			m_ses.disk_thread().async_hash(m_storage, m_checking_piece, v2_span, flags
				, [self = shared_from_this(), hashes = std::move(block_hashes)]
				(piece_index_t p, sha1_hash const& h, storage_error const& e)
				{ self->on_piece_hashed(std::move(hashes), p, h, e); });
			++m_checking_piece;
			m_ses.deferred_submit_jobs();
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("on_piece_hashed, m_checking_piece: %d"
				, static_cast<int>(m_checking_piece));
#endif
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("on_piece_hashed, completed");
#endif

		auto const& pack = settings();
		auto get_int_setting = [&pack](int const name) {
			int const v = pack.get_int(name);
			if (v < 0) return std::numeric_limits<int>::max();
			return v;
		};
		int const limit = std::min({
			get_int_setting(settings_pack::active_downloads)
			, get_int_setting(settings_pack::active_seeds)
			, get_int_setting(settings_pack::active_limit)});
		int const num_torrents = m_ses.num_torrents();
		if (m_auto_managed && num_torrents > limit)
		{
			// if we're auto managed and we've reached one of the limits. Assume
			// we need to be paused until the auto managed logic runs again
			// (which is triggered further down)
			set_paused(true);
		}

		// we're done checking! (this should cause a call to trigger_auto_manage)
		files_checked();

		// reset the checking state
		m_checking_piece = piece_index_t(0);
		m_num_checked_pieces = piece_index_t(0);
	}
	catch (...) { handle_exception(); }